

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextShutdown(ImGuiContext *ctx)

{
  ImGuiDockNode *p;
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = (ctx->DockContext).Nodes.Data.Size;
  if (0 < iVar1) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      p = *(ImGuiDockNode **)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar2);
      if (p != (ImGuiDockNode *)0x0) {
        IM_DELETE<ImGuiDockNode>(p);
        iVar1 = (ctx->DockContext).Nodes.Data.Size;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void ImGui::DockContextShutdown(ImGuiContext* ctx)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            IM_DELETE(node);
}